

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSIMDExtract(TranslateToFuzzReader *this,Type type)

{
  Id IVar1;
  SIMDExtractOp SVar2;
  FeatureOptions<wasm::SIMDExtractOp> *pFVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
  local_58;
  uint32_t uVar3;
  
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  switch(type.id & 0xffffffff) {
  case 0:
  case 1:
  case 6:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x11ab);
  case 2:
    SVar2 = Random::
            pick<wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp>
                      (&this->random,ExtractLaneSVecI8x16,ExtractLaneUVecI8x16,ExtractLaneSVecI16x8,
                       ExtractLaneUVecI16x8,ExtractLaneVecI32x4);
    break;
  case 3:
    SVar2 = ExtractLaneVecI64x2;
    break;
  case 4:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar4 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       ((FeatureOptions<wasm::SIMDExtractOp> *)&local_58,(FeatureSet)0x8,
                        ExtractLaneVecF32x4);
    pFVar4 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       (pFVar4,(FeatureSet)0x40000,ExtractLaneVecF16x8);
    SVar2 = Random::pick<wasm::SIMDExtractOp>(&this->random,pFVar4);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
    ::~_Rb_tree(&local_58);
    break;
  case 5:
    SVar2 = ExtractLaneVecF64x2;
    break;
  default:
    SVar2 = ExtractLaneSVecI8x16;
  }
  pEVar5 = make(this,(Type)0x6);
  if (SVar2 < (ExtractLaneVecF64x2|ExtractLaneUVecI8x16)) {
    uVar3 = Random::upTo(&this->random,*(uint32_t *)(&DAT_0018ddac + (ulong)SVar2 * 4));
    IVar1 = (Id)uVar3;
  }
  else {
    IVar1 = InvalidId;
  }
  pEVar6 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8)
  ;
  *(undefined8 *)pEVar6 = 0;
  (pEVar6->type).id = 0;
  *(undefined8 *)(pEVar6 + 1) = 0;
  pEVar6[1].type.id = 0;
  *(undefined8 *)(pEVar6 + 2) = 0;
  pEVar6->_id = SIMDExtractId;
  (pEVar6->type).id = 0;
  *(SIMDExtractOp *)(pEVar6 + 1) = SVar2;
  pEVar6[1].type.id = (uintptr_t)pEVar5;
  pEVar6[2]._id = IVar1;
  wasm::SIMDExtract::finalize();
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDExtract(Type type) {
  auto op = static_cast<SIMDExtractOp>(0);
  switch (type.getBasic()) {
    case Type::i32:
      op = pick(ExtractLaneSVecI8x16,
                ExtractLaneUVecI8x16,
                ExtractLaneSVecI16x8,
                ExtractLaneUVecI16x8,
                ExtractLaneVecI32x4);
      break;
    case Type::i64:
      op = ExtractLaneVecI64x2;
      break;
    case Type::f32:
      op = pick(FeatureOptions<SIMDExtractOp>()
                  .add(FeatureSet::SIMD, ExtractLaneVecF32x4)
                  .add(FeatureSet::FP16, ExtractLaneVecF16x8));
      break;
    case Type::f64:
      op = ExtractLaneVecF64x2;
      break;
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  Expression* vec = make(Type::v128);
  uint8_t index = 0;
  switch (op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
      index = upTo(16);
      break;
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecF16x8:
      index = upTo(8);
      break;
    case ExtractLaneVecI32x4:
    case ExtractLaneVecF32x4:
      index = upTo(4);
      break;
    case ExtractLaneVecI64x2:
    case ExtractLaneVecF64x2:
      index = upTo(2);
      break;
  }
  return builder.makeSIMDExtract(op, vec, index);
}